

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeywordExtractor.hpp
# Opt level: O0

void __thiscall
cppjieba::KeywordExtractor::LoadStopWordDict(KeywordExtractor *this,string *filePath)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  ostream *poVar4;
  istream *piVar5;
  size_type sVar6;
  string local_3d0 [8];
  string line;
  Logger local_3b0;
  istream local_220 [8];
  ifstream ifs;
  string *filePath_local;
  KeywordExtractor *this_local;
  
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,uVar3,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    limonp::Logger::Logger
              (&local_3b0,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/KeywordExtractor.hpp"
               ,0x7e);
    poVar4 = limonp::Logger::Stream(&local_3b0);
    poVar4 = std::operator<<(poVar4,"exp: [ifs.is_open()");
    poVar4 = std::operator<<(poVar4,"] false. ");
    poVar4 = std::operator<<(poVar4,"open ");
    poVar4 = std::operator<<(poVar4,(string *)filePath);
    std::operator<<(poVar4," failed");
    limonp::Logger::~Logger(&local_3b0);
  }
  std::__cxx11::string::string(local_3d0);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_3d0);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) break;
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->stopWords_,(value_type *)local_3d0);
  }
  sVar6 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->stopWords_);
  if (sVar6 != 0) {
    std::__cxx11::string::~string(local_3d0);
    std::ifstream::~ifstream(local_220);
    return;
  }
  __assert_fail("stopWords_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/KeywordExtractor.hpp"
                ,0x83,"void cppjieba::KeywordExtractor::LoadStopWordDict(const string &)");
}

Assistant:

void LoadStopWordDict(const string& filePath) {
    ifstream ifs(filePath.c_str());
    XCHECK(ifs.is_open()) << "open " << filePath << " failed";
    string line ;
    while (getline(ifs, line)) {
      stopWords_.insert(line);
    }
    assert(stopWords_.size());
  }